

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_set_in(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  int code;
  
  if (field == 0) {
    if (location < *(byte *)((long)segment->data + 0xe0)) {
      *(void **)((long)segment->data + (ulong)location * 8) = buffer;
      return 1;
    }
    code = 6;
  }
  else {
    code = 7;
  }
  mixed_err(code);
  return 0;
}

Assistant:

int channel_set_in(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(data->in_channels <= location){
      mixed_err(MIXED_INVALID_LOCATION);
      return 0;
    }
    data->in[location] = (struct mixed_buffer *)buffer;
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}